

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_spm(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx,tcg_ctx->cc_op,o->in1);
  tcg_gen_extract_i32_s390x(tcg_ctx,tcg_ctx->cc_op,tcg_ctx->cc_op,0x1c,2);
  set_cc_static(s);
  tcg_gen_shri_i64_s390x(tcg_ctx,o->in1,o->in1,0x18);
  tcg_gen_deposit_i64_s390x(tcg_ctx,tcg_ctx->psw_mask,tcg_ctx->psw_mask,o->in1,0x28,4);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_spm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_extrl_i64_i32(tcg_ctx, tcg_ctx->cc_op, o->in1);
    tcg_gen_extract_i32(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cc_op, 28, 2);
    set_cc_static(s);

    tcg_gen_shri_i64(tcg_ctx, o->in1, o->in1, 24);
    tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->psw_mask, tcg_ctx->psw_mask, o->in1, PSW_SHIFT_MASK_PM, 4);
    return DISAS_NEXT;
}